

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

int compression_end(archive *a,la_zstream *lastrm)

{
  la_zstream *lastrm_local;
  archive *a_local;
  
  if (lastrm->valid == 0) {
    a_local._4_4_ = 0;
  }
  else {
    lastrm->prop_size = 0;
    free(lastrm->props);
    lastrm->props = (uint8_t *)0x0;
    a_local._4_4_ = (*lastrm->end)(a,lastrm);
  }
  return a_local._4_4_;
}

Assistant:

static int
compression_end(struct archive *a, struct la_zstream *lastrm)
{
	if (lastrm->valid) {
		lastrm->prop_size = 0;
		free(lastrm->props);
		lastrm->props = NULL;
		return (lastrm->end(a, lastrm));
	}
	return (ARCHIVE_OK);
}